

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_ncons.cc
# Opt level: O3

int nc_match_single(GENERAL_NAME *gen,GENERAL_NAME *base)

{
  uint uVar1;
  uint uVar2;
  X509_NAME *a;
  X509_NAME *a_00;
  uchar *puVar3;
  int iVar4;
  int iVar5;
  CBS *cbs;
  CBS *pCVar6;
  uint8_t byte;
  CBS base_cbs;
  CBS eml_cbs;
  CBS host;
  CBS eml_local;
  uint8_t local_59;
  CBS local_58;
  CBS local_48;
  CBS local_38;
  CBS local_28;
  
  iVar4 = 0x33;
  switch(base->type) {
  case 1:
    local_48.len = (size_t)((gen->d).rfc822Name)->length;
    local_48.data = ((gen->d).rfc822Name)->data;
    local_58.len = (size_t)((base->d).rfc822Name)->length;
    local_58.data = ((base->d).rfc822Name)->data;
    iVar4 = CBS_get_until_first(&local_48,&local_28,'@');
    if (iVar4 == 0) {
      return 0x35;
    }
    iVar4 = CBS_get_until_first(&local_58,&local_38,'@');
    if (iVar4 == 0) {
      if ((local_58.len != 0) && (*local_58.data == '.')) goto LAB_0048ff5a;
    }
    else {
      if ((local_38.len != 0) &&
         (iVar4 = CBS_mem_equal(&local_38,
                                (uint8_t *)CONCAT71(local_28.data._1_7_,(char)local_28.data),
                                local_28.len), iVar4 == 0)) {
        return 0x2f;
      }
      if ((local_58.len == 0) || (*local_58.data != '@')) {
        __assert_fail("starts_with(&base_cbs, \'@\')",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_ncons.cc"
                      ,0x1ca,"int nc_email(const ASN1_IA5STRING *, const ASN1_IA5STRING *)");
      }
      CBS_skip(&local_58,1);
    }
    if ((local_48.len == 0) || (*local_48.data != '@')) {
      __assert_fail("starts_with(&eml_cbs, \'@\')",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_ncons.cc"
                    ,0x1cf,"int nc_email(const ASN1_IA5STRING *, const ASN1_IA5STRING *)");
    }
    cbs = &local_48;
    CBS_skip(cbs,1);
    pCVar6 = &local_58;
    break;
  case 2:
    uVar1 = ((gen->d).rfc822Name)->length;
    local_48.len = (size_t)(int)uVar1;
    local_48.data = ((gen->d).rfc822Name)->data;
    uVar2 = ((base->d).rfc822Name)->length;
    local_58.len = (size_t)(int)uVar2;
    local_58.data = ((base->d).rfc822Name)->data;
    if (local_58.len == 0) {
      return 0;
    }
    if (*local_58.data != '.') {
      if (uVar2 < uVar1) {
        iVar4 = CBS_skip(&local_48,~local_58.len + local_48.len);
        if (iVar4 == 0) {
          return 0x2f;
        }
        iVar4 = CBS_get_u8(&local_48,(uint8_t *)&local_28);
        if (iVar4 == 0) {
          return 0x2f;
        }
        if ((char)local_28.data != '.') {
          return 0x2f;
        }
      }
      pCVar6 = &local_48;
      cbs = &local_58;
      break;
    }
LAB_0048ff5a:
    pCVar6 = &local_48;
LAB_0048ff5f:
    iVar5 = has_suffix_case(pCVar6,&local_58);
    goto LAB_00490114;
  default:
    goto switchD_0048fdfc_caseD_3;
  case 4:
    a = (gen->d).directoryName;
    a_00 = (base->d).directoryName;
    if (((a->modified != 0) && (iVar4 = i2d_X509_NAME((X509_NAME *)a,(uchar **)0x0), iVar4 < 0)) ||
       ((a_00->modified != 0 && (iVar4 = i2d_X509_NAME((X509_NAME *)a_00,(uchar **)0x0), iVar4 < 0))
       )) {
      return 0x11;
    }
    iVar4 = a_00->canon_enclen;
    if (a->canon_enclen < iVar4) {
      return 0x2f;
    }
    if ((iVar4 != 0) && (iVar4 = bcmp(a_00->canon_enc,a->canon_enc,(long)iVar4), iVar4 != 0)) {
      return 0x2f;
    }
    return 0;
  case 6:
    local_48.len = (size_t)((gen->d).rfc822Name)->length;
    local_48.data = ((gen->d).rfc822Name)->data;
    iVar4 = ((base->d).rfc822Name)->length;
    local_58.len = (size_t)iVar4;
    puVar3 = ((base->d).rfc822Name)->data;
    local_58.data = puVar3;
    iVar5 = CBS_get_until_first(&local_48,&local_28,':');
    if (iVar5 == 0) {
      return 0x35;
    }
    iVar5 = CBS_skip(&local_48,1);
    if (iVar5 == 0) {
      return 0x35;
    }
    iVar5 = CBS_get_u8(&local_48,&local_59);
    if (iVar5 == 0) {
      return 0x35;
    }
    if (local_59 != '/') {
      return 0x35;
    }
    iVar5 = CBS_get_u8(&local_48,&local_59);
    if (iVar5 == 0) {
      return 0x35;
    }
    if (local_59 != '/') {
      return 0x35;
    }
    iVar5 = CBS_get_until_first(&local_48,&local_38,':');
    if ((iVar5 == 0) && (iVar5 = CBS_get_until_first(&local_48,&local_38,'/'), iVar5 == 0)) {
      local_38.data = local_48.data;
      local_38.len = local_48.len;
    }
    if (local_38.len == 0) {
      return 0x35;
    }
    if ((iVar4 != 0) && (*puVar3 == '.')) {
      pCVar6 = &local_38;
      goto LAB_0048ff5f;
    }
    pCVar6 = &local_58;
    cbs = &local_38;
  }
  iVar5 = equal_case(pCVar6,cbs);
LAB_00490114:
  iVar4 = 0x2f;
  if (iVar5 != 0) {
    iVar4 = 0;
  }
switchD_0048fdfc_caseD_3:
  return iVar4;
}

Assistant:

static int nc_match_single(GENERAL_NAME *gen, GENERAL_NAME *base) {
  switch (base->type) {
    case GEN_DIRNAME:
      return nc_dn(gen->d.directoryName, base->d.directoryName);

    case GEN_DNS:
      return nc_dns(gen->d.dNSName, base->d.dNSName);

    case GEN_EMAIL:
      return nc_email(gen->d.rfc822Name, base->d.rfc822Name);

    case GEN_URI:
      return nc_uri(gen->d.uniformResourceIdentifier,
                    base->d.uniformResourceIdentifier);

    default:
      return X509_V_ERR_UNSUPPORTED_CONSTRAINT_TYPE;
  }
}